

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-slays.c
# Opt level: O0

_Bool append_slay(_Bool **current,wchar_t pick)

{
  slay_conflict *psVar1;
  _Bool _Var2;
  _Bool *p_Var3;
  slay_conflict *slay;
  wchar_t i;
  wchar_t pick_local;
  _Bool **current_local;
  
  psVar1 = slays;
  if (*current == (_Bool *)0x0) {
    p_Var3 = (_Bool *)mem_zalloc((ulong)z_info->slay_max);
    *current = p_Var3;
    (*current)[pick] = true;
  }
  else {
    for (slay._0_4_ = L'\x01'; (wchar_t)slay < (int)(uint)z_info->slay_max;
        slay._0_4_ = (wchar_t)slay + L'\x01') {
      if ((((*current)[(wchar_t)slay] & 1U) != 0) &&
         (_Var2 = same_monsters_slain((wchar_t)slay,pick), _Var2)) {
        if (psVar1[pick].multiplier <= slays[(wchar_t)slay].multiplier) {
          return false;
        }
        (*current)[(wchar_t)slay] = false;
        (*current)[pick] = true;
        return true;
      }
    }
    (*current)[pick] = true;
  }
  return true;
}

Assistant:

bool append_slay(bool **current, int pick)
{
	int i;
	struct slay *slay = &slays[pick];

	/* No existing slays means OK to add */
	if (!(*current)) {
		*current = mem_zalloc(z_info->slay_max * sizeof(bool));
		(*current)[pick] = true;
		return true;
	}

	/* Check the existing slays for base/flag matches */
	for (i = 1; i < z_info->slay_max; i++) {
		if ((*current)[i]) {
			/*
			 * If affecting the same creatures, check the multiplier
			 */
			if (same_monsters_slain(i, pick)) {
				/* Same multiplier or smaller, fail */
				if (slay->multiplier <= slays[i].multiplier)
					return false;

				/* Greater multiplier, replace and accept */
				(*current)[i] = false;
				(*current)[pick] = true;
				return true;
			}
		}
	}

	/* We can add the new one now */
	(*current)[pick] = true;

	return true;
}